

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckDoubleMaximum
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,double d)

{
  ValueType *this_00;
  Ch *pCVar1;
  ValidateErrorCode VVar2;
  double dVar3;
  double d_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if ((this->exclusiveMaximum_ & 1U) == 0) {
    dVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble(&this->maximum_)
    ;
    if (dVar3 < d) goto LAB_00185a3f;
  }
  else {
    dVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble(&this->maximum_)
    ;
    if (dVar3 <= d) {
LAB_00185a3f:
      (*context->error_handler->_vptr_IValidationErrorHandler[7])
                (d,context->error_handler,&this->maximum_,(ulong)this->exclusiveMaximum_ & 1);
      VVar2 = kValidateErrorMaximum;
      if ((this->exclusiveMaximum_ & 1U) != 0) {
        VVar2 = kValidateErrorExclusiveMaximum;
      }
      context->invalidCode = VVar2;
      VVar2 = kValidateErrorMaximum;
      if ((this->exclusiveMaximum_ & 1U) != 0) {
        VVar2 = kValidateErrorExclusiveMaximum;
      }
      this_00 = GetValidateErrorKeyword(VVar2);
      pCVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this_00);
      context->invalidKeyword = pCVar1;
      return false;
    }
  }
  return true;
}

Assistant:

bool CheckDoubleMaximum(Context& context, double d) const {
        if (exclusiveMaximum_ ? d >= maximum_.GetDouble() : d > maximum_.GetDouble()) {
            context.error_handler.AboveMaximum(d, maximum_, exclusiveMaximum_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum);
        }
        return true;
    }